

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyEnvironment.cpp
# Opt level: O0

WebAssemblyTable * __thiscall
Js::WebAssemblyEnvironment::GetVarElement<Js::WebAssemblyTable>
          (WebAssemblyEnvironment *this,Type *ptr,uint32 index,uint32 maxCount)

{
  Var aValue;
  bool bVar1;
  void **ppvVar2;
  Var varFunc;
  Type *functionPtr;
  uint32 maxCount_local;
  uint32 index_local;
  Type *ptr_local;
  WebAssemblyEnvironment *this_local;
  
  if (maxCount <= index) {
    Throw::InternalError();
  }
  CheckPtrIsValid<Js::WebAssemblyTable*>(this,(intptr_t)(ptr + index));
  ppvVar2 = Memory::WriteBarrierPtr::operator_cast_to_void__((WriteBarrierPtr *)(ptr + index));
  aValue = *ppvVar2;
  if (aValue == (Var)0x0) {
    this_local = (WebAssemblyEnvironment *)0x0;
  }
  else {
    bVar1 = VarIs<Js::WebAssemblyTable>(aValue);
    if (!bVar1) {
      Throw::InternalError();
    }
    this_local = (WebAssemblyEnvironment *)VarTo<Js::WebAssemblyTable>(aValue);
  }
  return (WebAssemblyTable *)this_local;
}

Assistant:

T* WebAssemblyEnvironment::GetVarElement(Field(Var)* ptr, uint32 index, uint32 maxCount) const
{
    if (index >= maxCount)
    {
        Js::Throw::InternalError();
    }

    Field(Var)* functionPtr = ptr + index;
    CheckPtrIsValid<T*>((intptr_t)functionPtr);
    Var varFunc = *functionPtr;
    if (varFunc)
    {
        if (!VarIs<T>(varFunc))
        {
            Js::Throw::InternalError();
        }
        return VarTo<T>(varFunc);
    }
    return nullptr;
}